

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O0

itype * __thiscall
pybind11::detail::type_caster_base::operator_cast_to_Data_(type_caster_base *this)

{
  reference_cast_error *this_00;
  type_caster_base<asd::Data<short,_asd::channel<2UL>,_asd::version<2UL>,_asd::container::vec>_>
  *this_local;
  
  if (*(long *)(this + 0x10) == 0) {
    this_00 = (reference_cast_error *)__cxa_allocate_exception(0x10);
    reference_cast_error::reference_cast_error(this_00);
    __cxa_throw(this_00,&reference_cast_error::typeinfo,reference_cast_error::~reference_cast_error)
    ;
  }
  return *(itype **)(this + 0x10);
}

Assistant:

operator itype &() {
        if (!value) {
            throw reference_cast_error();
        }
        return *((itype *) value);
    }